

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

void av1_rd_pick_palette_intra_sbuv
               (AV1_COMP *cpi,MACROBLOCK *x,int dc_mode_cost,uint8_t *best_palette_color_map,
               MB_MODE_INFO *best_mbmi,int64_t *best_rd,int *rate,int *rate_tokenonly,
               int64_t *distortion,uint8_t *skippable)

{
  uint8_t *puVar1;
  BLOCK_SIZE bsize;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  int16_t iVar5;
  short sVar6;
  SequenceHeader *pSVar7;
  byte *pbVar8;
  PALETTE_BUFFER *pPVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  PALETTE_MODE_INFO *pPVar13;
  aom_bit_depth_t aVar14;
  uint16_t uVar15;
  int64_t iVar16;
  int iVar17;
  int iVar18;
  ushort *puVar19;
  uint uVar20;
  ulong uVar21;
  int16_t *piVar22;
  uint uVar23;
  long lVar24;
  size_t __n;
  uint8_t *puVar25;
  uint8_t *puVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint8_t *puVar31;
  uint16_t *puVar32;
  ulong uVar33;
  ushort uVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  uint8_t *puVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  ushort *puVar44;
  ulong uVar45;
  int16_t iVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  uint uVar50;
  uint8_t *puVar51;
  MACROBLOCK *pMVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  int k;
  int16_t *data;
  ulong uVar56;
  ushort uVar57;
  uint8_t *__dest;
  uint local_459c;
  int colors_threshold_v;
  int colors_threshold_u;
  int colors_u;
  ulong local_4570;
  byte *local_4568;
  MB_MODE_INFO *local_4560;
  uint8_t *local_4558;
  byte *local_4550;
  uint local_4548;
  int local_4544;
  uint local_4540;
  int colors_v;
  MACROBLOCK *local_4538;
  long local_4530;
  AV1_COMP *local_4528;
  uint8_t *local_4520;
  int16_t centroids [16];
  uint local_44f8;
  uint16_t color_cache [16];
  RD_STATS tokenonly_rd_stats;
  
  local_4560 = *(x->e_mbd).mi;
  bsize = local_4560->bsize;
  pSVar7 = (cpi->common).seq_params;
  colors_threshold_u = 0;
  colors_threshold_v = 0;
  iVar18 = (x->e_mbd).mb_to_bottom_edge;
  iVar28 = (x->e_mbd).mb_to_right_edge;
  bVar2 = (byte)(x->e_mbd).plane[1].subsampling_x;
  bVar3 = (byte)(x->e_mbd).plane[1].subsampling_y;
  bVar10 = block_size_wide[bsize] >> (bVar2 & 0x1f);
  bVar11 = block_size_high[bsize] >> (bVar3 & 0x1f);
  uVar23 = (int)((iVar18 >> 0x1f & iVar18 >> 3) + (uint)block_size_high[bsize]) >> (bVar3 & 0x1f);
  uVar53 = (int)((iVar28 >> 0x1f & iVar28 >> 3) + (uint)block_size_wide[bsize]) >> (bVar2 & 0x1f);
  iVar18 = x->plane[1].src.stride;
  local_4550 = x->plane[1].src.buf;
  pbVar8 = x->plane[2].src.buf;
  local_4558 = (x->e_mbd).plane[1].color_index_map;
  local_4560->uv_mode = '\0';
  uVar20 = uVar23 + (uint)(bVar11 < 4) * 2;
  local_4570 = (ulong)uVar20;
  local_459c = uVar53 + (uint)(bVar10 < 4) * 2;
  local_4568 = pbVar8;
  local_4544 = dc_mode_cost;
  local_4528 = cpi;
  if (pSVar7->use_highbitdepth == '\0') {
    av1_count_colors(local_4550,iVar18,uVar20,local_459c,&tokenonly_rd_stats.rate,&colors_u);
    av1_count_colors(pbVar8,iVar18,(int)local_4570,local_459c,&tokenonly_rd_stats.rate,&colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }
  else {
    av1_count_colors_highbd
              (local_4550,iVar18,uVar20,local_459c,pSVar7->bit_depth,&tokenonly_rd_stats.rate,
               (int *)color_cache,&colors_threshold_u,&colors_u);
    av1_count_colors_highbd
              (pbVar8,iVar18,(int)local_4570,local_459c,pSVar7->bit_depth,&tokenonly_rd_stats.rate,
               (int *)color_cache,&colors_threshold_v,&colors_v);
  }
  uVar54 = (uint)bVar10 + (uint)(bVar10 < 4) * 2;
  uVar20 = (uint)bVar11 + (uint)(bVar11 < 4) * 2;
  local_4540 = av1_get_palette_cache(&x->e_mbd,1,color_cache);
  iVar28 = colors_threshold_v;
  if (colors_threshold_v < colors_threshold_u) {
    iVar28 = colors_threshold_u;
  }
  uVar40 = uVar54;
  if (iVar28 - 2U < 0x3f) {
    puVar19 = (ushort *)((long)local_4550 * 2);
    puVar44 = (ushort *)((long)local_4568 * 2);
    uVar4 = pSVar7->use_highbitdepth;
    if (uVar4 == '\0') {
      uVar27 = (uint)*local_4550;
      uVar50 = (uint)*local_4568;
    }
    else {
      uVar27 = (uint)*puVar19;
      uVar50 = (uint)*puVar44;
    }
    pPVar9 = x->palette_buffer;
    data = pPVar9->kmeans_data_buf;
    iVar28 = (int)local_4570;
    local_4520 = (uint8_t *)(local_4570 & 0xffffffff);
    uVar35 = uVar50;
    uVar55 = uVar27;
    if (0 < iVar28) {
      uVar30 = (ulong)local_459c;
      local_4530 = uVar30 * 2;
      lVar48 = 0;
      puVar26 = (uint8_t *)0x0;
      pbVar8 = local_4568;
      piVar22 = data;
      do {
        local_4568 = pbVar8;
        if (0 < (int)local_459c) {
          uVar41 = 0;
          lVar47 = lVar48;
          uVar12 = uVar35;
          do {
            if (uVar4 == '\0') {
              uVar34 = (ushort)local_4550[uVar41];
              uVar57 = (ushort)local_4568[uVar41];
              piVar22[uVar41 * 2] = uVar34;
              lVar24 = lVar47;
            }
            else {
              uVar34 = puVar19[uVar41];
              uVar57 = puVar44[uVar41];
              piVar22[uVar41 * 2] = uVar34;
              lVar24 = (uVar41 + (long)puVar26 * uVar30) * 2;
            }
            uVar35 = (uint)uVar57;
            uVar42 = (uint)uVar34;
            uVar43 = uVar27;
            if (uVar27 < uVar42) {
              uVar43 = uVar42;
            }
            if (uVar42 < uVar55) {
              uVar43 = uVar27;
              uVar55 = uVar42;
            }
            uVar27 = uVar43;
            uVar43 = uVar50;
            if (uVar50 < uVar35) {
              uVar43 = uVar35;
            }
            if (uVar12 <= uVar35) {
              uVar35 = uVar12;
              uVar50 = uVar43;
            }
            pPVar9->kmeans_data_buf[lVar24 + 1] = uVar57;
            uVar41 = uVar41 + 1;
            lVar47 = lVar47 + 2;
            uVar12 = uVar35;
          } while (uVar30 != uVar41);
        }
        puVar26 = puVar26 + 1;
        lVar48 = lVar48 + local_4530;
        piVar22 = piVar22 + uVar30 * 2;
        local_4550 = local_4550 + iVar18;
        puVar19 = puVar19 + iVar18;
        puVar44 = puVar44 + iVar18;
        pbVar8 = local_4568 + iVar18;
      } while (puVar26 != local_4520);
    }
    if (colors_v < colors_u) {
      colors_v = colors_u;
    }
    local_4548 = uVar54;
    local_4538 = x;
    if (1 < colors_v) {
      iVar18 = 8;
      if (colors_v < 8) {
        iVar18 = colors_v;
      }
      local_4530 = CONCAT44(local_4530._4_4_,iVar28 * local_459c);
      __n = (size_t)(int)local_459c;
      local_4568 = (byte *)(long)(int)(uVar54 - local_459c);
      uVar30 = (ulong)uVar54;
      puVar26 = local_4558 + (int)((iVar28 + -1) * uVar54);
      iVar17 = 2;
      if (2 < iVar18) {
        iVar17 = iVar18;
      }
      puVar1 = local_4520 + 1;
      puVar38 = local_4558 + (long)(local_4520 + -1) * __n;
      local_4550 = (byte *)-__n;
      local_4520 = local_4558 + (long)(local_4520 + -1) * uVar30;
      puVar31 = local_4558 + (long)iVar28 * uVar30;
      uVar41 = (ulong)local_4540;
      pPVar13 = &local_4560->palette_mode_info;
      uVar56 = 2;
      do {
        uVar39 = 0;
        iVar18 = uVar50 - uVar35;
        iVar29 = uVar27 - uVar55;
        do {
          k = (int)uVar56;
          centroids[uVar39 * 2] =
               (short)(((uint)((ulong)((long)iVar29 / (long)k) >> 0x1f) & 1) +
                       (int)((long)iVar29 / (long)k) >> 1) + (short)uVar55;
          centroids[uVar39 * 2 + 1] =
               (short)(((uint)((ulong)((long)iVar18 / (long)k) >> 0x1f) & 1) +
                       (int)((long)iVar18 / (long)k) >> 1) + (short)uVar35;
          uVar39 = uVar39 + 1;
          iVar29 = iVar29 + uVar27 * 2 + uVar55 * -2;
          iVar18 = iVar18 + uVar50 * 2 + uVar35 * -2;
        } while (uVar56 != uVar39);
        av1_k_means_dim2(data,centroids,local_4558,(int)local_4530,k,0x32);
        uVar15 = color_cache[0];
        if (0 < (int)local_4540) {
          aVar14 = ((local_4528->common).seq_params)->bit_depth;
          uVar39 = 0;
          do {
            iVar29 = (int)centroids[uVar39] - (uint)uVar15;
            iVar18 = -iVar29;
            if (0 < iVar29) {
              iVar18 = iVar29;
            }
            if (local_4540 == 1) {
              lVar48 = 0;
            }
            else {
              iVar29 = 0;
              uVar21 = 1;
              iVar36 = iVar18;
              do {
                iVar18 = (int)centroids[uVar39] - (uint)color_cache[uVar21];
                iVar37 = -iVar18;
                if (0 < iVar18) {
                  iVar37 = iVar18;
                }
                iVar18 = iVar37;
                if (iVar36 <= iVar37) {
                  iVar18 = iVar36;
                }
                if (iVar37 < iVar36) {
                  iVar29 = (int)uVar21;
                }
                uVar21 = uVar21 + 1;
                iVar36 = iVar18;
              } while (uVar41 != uVar21);
              lVar48 = (long)iVar29;
            }
            if (iVar18 <= 4 << ((char)aVar14 - AOM_BITS_8 & 0x1f)) {
              centroids[uVar39] = color_cache[lVar48];
            }
            uVar39 = uVar39 + 2;
          } while (uVar39 < uVar56 * 2);
        }
        uVar21 = 2;
        uVar39 = 0;
        do {
          iVar5 = centroids[uVar39];
          uVar33 = uVar39 + 2;
          uVar45 = uVar39 & 0xffffffff;
          uVar49 = uVar21;
          iVar46 = iVar5;
          do {
            sVar6 = centroids[uVar49];
            if (sVar6 < iVar46) {
              uVar45 = uVar49 & 0xffffffff;
            }
            if (sVar6 <= iVar46) {
              iVar46 = sVar6;
            }
            uVar49 = uVar49 + 2;
          } while (uVar49 < uVar56 * 2);
          if (uVar39 != uVar45) {
            iVar46 = centroids[uVar39 + 1];
            lVar48 = (long)(int)uVar45;
            centroids[uVar39] = centroids[lVar48];
            centroids[uVar39 + 1] = centroids[lVar48 + 1];
            centroids[lVar48] = iVar5;
            centroids[lVar48 + 1] = iVar46;
          }
          uVar21 = uVar21 + 2;
          uVar39 = uVar33;
        } while (uVar33 < uVar56 * 2 - 2);
        (*av1_calc_indices_dim2)(data,centroids,local_4558,(int64_t *)0x0,(int)local_4530,k);
        if (bVar11 != uVar23 || bVar10 != uVar53) {
          puVar25 = puVar38;
          puVar51 = puVar1;
          __dest = local_4520;
          if (0 < (int)local_4570) {
            do {
              memmove(__dest,puVar25,__n);
              memset(__dest + __n,(uint)__dest[__n - 1],(size_t)local_4568);
              puVar51 = puVar51 + -1;
              puVar25 = puVar25 + (long)local_4550;
              __dest = __dest + -uVar30;
            } while (1 < (long)puVar51);
          }
          local_44f8 = (uint)bVar11;
          puVar25 = puVar31;
          lVar48 = (ulong)uVar20 - (long)iVar28;
          if ((int)uVar23 < (int)local_44f8) {
            do {
              memcpy(puVar25,puVar26,uVar30);
              puVar25 = puVar25 + uVar30;
              lVar48 = lVar48 + -1;
            } while (lVar48 != 0);
          }
        }
        pMVar52 = local_4538;
        (local_4560->palette_mode_info).palette_size[1] = (uint8_t)uVar56;
        uVar4 = pSVar7->use_highbitdepth;
        lVar48 = 1;
        piVar22 = centroids;
        puVar32 = pPVar13->palette_colors;
        do {
          puVar32 = puVar32 + 8;
          uVar39 = 0;
          do {
            if (uVar4 == '\0') {
              uVar34 = piVar22[uVar39 * 2];
              if ((short)uVar34 < 1) {
                uVar34 = 0;
              }
              uVar40 = (uint)uVar34;
              if (0xfe < uVar34) {
                uVar40 = 0xff;
              }
            }
            else {
              uVar40 = (uint)piVar22[uVar39 * 2];
              if (pSVar7->bit_depth == AOM_BITS_10) {
                if (0x3fe < (int)uVar40) {
                  uVar40 = 0x3ff;
                }
              }
              else if (pSVar7->bit_depth == AOM_BITS_12) {
                if (0xffe < (int)uVar40) {
                  uVar40 = 0xfff;
                }
              }
              else if (0xfe < (int)uVar40) {
                uVar40 = 0xff;
              }
              if ((int)uVar40 < 1) {
                uVar40 = 0;
              }
            }
            puVar32[uVar39] = (uint16_t)uVar40;
            uVar39 = uVar39 + 1;
          } while (uVar56 != uVar39);
          lVar48 = lVar48 + 1;
          piVar22 = piVar22 + 1;
        } while (lVar48 != 3);
        if ((local_4528->sf).intra_sf.early_term_chroma_palette_size_search == 0) {
          av1_txfm_uvrd(local_4528,local_4538,&tokenonly_rd_stats,bsize,*best_rd);
          iVar18 = tokenonly_rd_stats.rate;
          pMVar52 = local_4538;
          if (tokenonly_rd_stats.rate != 0x7fffffff) {
            iVar29 = intra_mode_info_cost_uv(local_4528,local_4538,local_4560,bsize,local_4544);
            local_459c = iVar29 + iVar18;
            goto LAB_00307ed5;
          }
        }
        else {
          iVar18 = intra_mode_info_cost_uv(local_4528,local_4538,local_4560,bsize,local_4544);
          iVar29 = 8;
          if ((long)pMVar52->rdmult * (long)iVar18 + 0x100 >> 9 < *best_rd) {
            av1_txfm_uvrd(local_4528,pMVar52,&tokenonly_rd_stats,bsize,*best_rd);
            if (tokenonly_rd_stats.rate != 0x7fffffff) {
              local_459c = iVar18 + tokenonly_rd_stats.rate;
            }
            iVar29 = 0;
            if (tokenonly_rd_stats.rate == 0x7fffffff) {
              iVar29 = 10;
            }
          }
          pMVar52 = local_4538;
          if (iVar29 == 0) {
LAB_00307ed5:
            iVar16 = tokenonly_rd_stats.dist;
            lVar48 = tokenonly_rd_stats.dist * 0x80 +
                     ((long)pMVar52->rdmult * (long)(int)local_459c + 0x100 >> 9);
            if (lVar48 < *best_rd) {
              *best_rd = lVar48;
              memcpy(best_mbmi,local_4560,0xb0);
              memcpy(best_palette_color_map,local_4558,(ulong)(uVar20 * uVar54));
              *rate = local_459c;
              *distortion = iVar16;
              *rate_tokenonly = tokenonly_rd_stats.rate;
              *skippable = tokenonly_rd_stats.skip_txfm;
            }
          }
          else {
            uVar40 = local_4548;
            if (iVar29 != 10) break;
          }
        }
        uVar56 = uVar56 + 1;
        uVar40 = local_4548;
      } while (uVar56 != iVar17 + 1);
    }
  }
  if ((best_mbmi->palette_mode_info).palette_size[1] != '\0') {
    memcpy(local_4558,best_palette_color_map,(ulong)(uVar20 * uVar40));
  }
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sbuv(const AV1_COMP *cpi, MACROBLOCK *x,
                                    int dc_mode_cost,
                                    uint8_t *best_palette_color_map,
                                    MB_MODE_INFO *const best_mbmi,
                                    int64_t *best_rd, int *rate,
                                    int *rate_tokenonly, int64_t *distortion,
                                    uint8_t *skippable) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           mbmi->bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  int this_rate;
  int64_t this_rd;
  int colors_u, colors_v;
  int colors_threshold_u = 0, colors_threshold_v = 0, colors_threshold = 0;
  const int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  uint8_t *const color_map = xd->plane[1].color_index_map;
  RD_STATS tokenonly_rd_stats;
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  mbmi->uv_mode = UV_DC_PRED;
  if (seq_params->use_highbitdepth) {
    int count_buf[1 << 12];      // Maximum (1 << 12) color levels.
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src_u, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_u, &colors_u);
    av1_count_colors_highbd(src_v, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_v, &colors_v);
  } else {
    int count_buf[1 << 8];
    av1_count_colors(src_u, src_stride, rows, cols, count_buf, &colors_u);
    av1_count_colors(src_v, src_stride, rows, cols, count_buf, &colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }

  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 1, color_cache);

  colors_threshold = colors_threshold_u > colors_threshold_v
                         ? colors_threshold_u
                         : colors_threshold_v;
  if (colors_threshold > 1 && colors_threshold <= 64) {
    int r, c, n, i, j;
    const int max_itr = 50;
    int lb_u, ub_u, val_u;
    int lb_v, ub_v, val_v;
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[2 * PALETTE_MAX_SIZE];

    uint16_t *src_u16 = CONVERT_TO_SHORTPTR(src_u);
    uint16_t *src_v16 = CONVERT_TO_SHORTPTR(src_v);
    if (seq_params->use_highbitdepth) {
      lb_u = src_u16[0];
      ub_u = src_u16[0];
      lb_v = src_v16[0];
      ub_v = src_v16[0];
    } else {
      lb_u = src_u[0];
      ub_u = src_u[0];
      lb_v = src_v[0];
      ub_v = src_v[0];
    }

    for (r = 0; r < rows; ++r) {
      for (c = 0; c < cols; ++c) {
        if (seq_params->use_highbitdepth) {
          val_u = src_u16[r * src_stride + c];
          val_v = src_v16[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        } else {
          val_u = src_u[r * src_stride + c];
          val_v = src_v[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        }
        if (val_u < lb_u)
          lb_u = val_u;
        else if (val_u > ub_u)
          ub_u = val_u;
        if (val_v < lb_v)
          lb_v = val_v;
        else if (val_v > ub_v)
          ub_v = val_v;
      }
    }

    const int colors = colors_u > colors_v ? colors_u : colors_v;
    const int max_colors =
        colors > PALETTE_MAX_SIZE ? PALETTE_MAX_SIZE : colors;
    for (n = PALETTE_MIN_SIZE; n <= max_colors; ++n) {
      for (i = 0; i < n; ++i) {
        centroids[i * 2] = lb_u + (2 * i + 1) * (ub_u - lb_u) / n / 2;
        centroids[i * 2 + 1] = lb_v + (2 * i + 1) * (ub_v - lb_v) / n / 2;
      }
      av1_k_means(data, centroids, color_map, rows * cols, n, 2, max_itr);
      optimize_palette_colors(color_cache, n_cache, n, 2, centroids,
                              cpi->common.seq_params->bit_depth);
      // Sort the U channel colors in ascending order.
      for (i = 0; i < 2 * (n - 1); i += 2) {
        int min_idx = i;
        int min_val = centroids[i];
        for (j = i + 2; j < 2 * n; j += 2)
          if (centroids[j] < min_val) min_val = centroids[j], min_idx = j;
        if (min_idx != i) {
          int temp_u = centroids[i], temp_v = centroids[i + 1];
          centroids[i] = centroids[min_idx];
          centroids[i + 1] = centroids[min_idx + 1];
          centroids[min_idx] = temp_u, centroids[min_idx + 1] = temp_v;
        }
      }
      av1_calc_indices(data, centroids, color_map, rows * cols, n, 2);
      extend_palette_color_map(color_map, cols, rows, plane_block_width,
                               plane_block_height);
      pmi->palette_size[1] = n;
      for (i = 1; i < 3; ++i) {
        for (j = 0; j < n; ++j) {
          if (seq_params->use_highbitdepth)
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] = clip_pixel_highbd(
                (int)centroids[j * 2 + i - 1], seq_params->bit_depth);
          else
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] =
                clip_pixel((int)centroids[j * 2 + i - 1]);
        }
      }

      if (cpi->sf.intra_sf.early_term_chroma_palette_size_search) {
        const int palette_mode_rate =
            intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
        const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
        // Terminate further palette_size search, if header cost corresponding
        // to lower palette_size is more than the best_rd.
        if (header_rd >= *best_rd) break;
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
      } else {
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate +
                    intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
      }

      this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
      if (this_rd < *best_rd) {
        *best_rd = this_rd;
        *best_mbmi = *mbmi;
        memcpy(best_palette_color_map, color_map,
               plane_block_width * plane_block_height *
                   sizeof(best_palette_color_map[0]));
        *rate = this_rate;
        *distortion = tokenonly_rd_stats.dist;
        *rate_tokenonly = tokenonly_rd_stats.rate;
        *skippable = tokenonly_rd_stats.skip_txfm;
      }
    }
  }
  if (best_mbmi->palette_mode_info.palette_size[1] > 0) {
    memcpy(color_map, best_palette_color_map,
           plane_block_width * plane_block_height *
               sizeof(best_palette_color_map[0]));
  }
}